

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O1

int __thiscall CPU::instrLDA0xb1(CPU *this)

{
  Memory *this_00;
  byte bVar1;
  uint16_t addr;
  
  this_00 = this->m;
  addr = indirect_indexed_addr_j(this);
  bVar1 = Memory::Read8(this_00,addr);
  this->A = bVar1;
  this->field_0x2e = bVar1 >> 7 | (bVar1 == 0) << 6 | this->field_0x2e & 0xbe;
  return 5;
}

Assistant:

int CPU::instrLDA0xb1() {
	LDA(indirect_indexed_addr());
	return 5;
}